

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cell.hpp
# Opt level: O2

void __thiscall Excel::Cell::Cell(Cell *this)

{
  (this->m_stringData)._M_dataplus._M_p = (pointer)&(this->m_stringData).field_2;
  (this->m_stringData)._M_string_length = 0;
  (this->m_stringData).field_2._M_local_buf[0] = L'\0';
  this->m_doubleData = 0.0;
  Formula::Formula(&this->m_formula);
  this->m_isNull = true;
  this->m_type = Unknown;
  return;
}

Assistant:

inline
Cell::Cell()
	:	m_doubleData( 0.0 )
	,	m_isNull( true )
	,	m_type( DataType::Unknown )
{
}